

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppPropertyEditor::funcs::ShowDummyObject(char *prefix,int uid)

{
  bool bVar1;
  int local_1c;
  int i;
  bool node_open;
  int uid_local;
  char *prefix_local;
  
  ImGui::PushID(uid);
  ImGui::AlignTextToFramePadding();
  bVar1 = ImGui::TreeNode("Object","%s_%u",prefix,(ulong)(uint)uid);
  ImGui::NextColumn();
  ImGui::AlignTextToFramePadding();
  ImGui::Text("my sailor is rich");
  ImGui::NextColumn();
  if (bVar1) {
    for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
      ImGui::PushID(local_1c);
      if (local_1c < 2) {
        ShowDummyObject("Child",0x67932);
      }
      else {
        ImGui::AlignTextToFramePadding();
        ImGui::TreeNodeEx("Field",0x308,"Field_%d");
        ImGui::NextColumn();
        ImGui::SetNextItemWidth(-1.0);
        if (local_1c < 5) {
          ImGui::DragFloat("##value",ShowDummyObject::dummy_members + local_1c,0.01,0.0,0.0,"%.3f",
                           1.0);
        }
        else {
          ImGui::InputFloat("##value",ShowDummyObject::dummy_members + local_1c,1.0,0.0,"%.3f",0);
        }
        ImGui::NextColumn();
      }
      ImGui::PopID();
    }
    ImGui::TreePop();
  }
  ImGui::PopID();
  return;
}

Assistant:

static void ShowDummyObject(const char* prefix, int uid)
        {
            ImGui::PushID(uid);                      // Use object uid as identifier. Most commonly you could also use the object pointer as a base ID.
            ImGui::AlignTextToFramePadding();  // Text and Tree nodes are less high than regular widgets, here we add vertical spacing to make the tree lines equal high.
            bool node_open = ImGui::TreeNode("Object", "%s_%u", prefix, uid);
            ImGui::NextColumn();
            ImGui::AlignTextToFramePadding();
            ImGui::Text("my sailor is rich");
            ImGui::NextColumn();
            if (node_open)
            {
                static float dummy_members[8] = { 0.0f,0.0f,1.0f,3.1416f,100.0f,999.0f };
                for (int i = 0; i < 8; i++)
                {
                    ImGui::PushID(i); // Use field index as identifier.
                    if (i < 2)
                    {
                        ShowDummyObject("Child", 424242);
                    }
                    else
                    {
                        // Here we use a TreeNode to highlight on hover (we could use e.g. Selectable as well)
                        ImGui::AlignTextToFramePadding();
                        ImGui::TreeNodeEx("Field", ImGuiTreeNodeFlags_Leaf | ImGuiTreeNodeFlags_NoTreePushOnOpen | ImGuiTreeNodeFlags_Bullet, "Field_%d", i);
                        ImGui::NextColumn();
                        ImGui::SetNextItemWidth(-1);
                        if (i >= 5)
                            ImGui::InputFloat("##value", &dummy_members[i], 1.0f);
                        else
                            ImGui::DragFloat("##value", &dummy_members[i], 0.01f);
                        ImGui::NextColumn();
                    }
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
            ImGui::PopID();
        }